

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

void * If_ManSatBuildFromCell
                 (char *pStr,Vec_Int_t **pvPiVars,Vec_Int_t **pvPoVars,Ifn_Ntk_t **ppNtk)

{
  Ifn_Ntk_t *p_00;
  Ifn_Ntk_t *p;
  Ifn_Ntk_t **ppNtk_local;
  Vec_Int_t **pvPoVars_local;
  Vec_Int_t **pvPiVars_local;
  char *pStr_local;
  
  p_00 = Ifn_NtkParse(pStr);
  Ifn_Prepare(p_00,(word *)0x0,p_00->nInps);
  *ppNtk = p_00;
  if (p_00 == (Ifn_Ntk_t *)0x0) {
    pStr_local = (char *)0x0;
  }
  else {
    pStr_local = (char *)Ifn_ManSatBuild(p_00,pvPiVars,pvPoVars);
  }
  return pStr_local;
}

Assistant:

void * If_ManSatBuildFromCell( char * pStr, Vec_Int_t ** pvPiVars, Vec_Int_t ** pvPoVars, Ifn_Ntk_t ** ppNtk )
{
    Ifn_Ntk_t * p = Ifn_NtkParse( pStr );
    Ifn_Prepare( p, NULL, p->nInps );
    *ppNtk = p;
    if ( p == NULL )
        return NULL;
//    Ifn_NtkPrint( p );
    return Ifn_ManSatBuild( p, pvPiVars, pvPoVars );
}